

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O0

void __thiscall S2Loop::Invert(S2Loop *this)

{
  Vector3<double> *__first;
  S2Point *pSVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  R1Interval *pRVar5;
  S2LatLngRect *pSVar6;
  double dVar7;
  S2LatLngRect local_80;
  VType local_58;
  VType local_50;
  VType local_48;
  byte local_29;
  S2LogMessage local_28;
  S2LogMessageVoidify local_11;
  S2Loop *local_10;
  S2Loop *this_local;
  
  local_29 = 0;
  local_10 = this;
  if (((this->owns_vertices_ ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop.cc"
               ,0x169,kFatal,(ostream *)&std::cerr);
    local_29 = 1;
    poVar4 = S2LogMessage::stream(&local_28);
    poVar4 = std::operator<<(poVar4,"Check failed: owns_vertices_ ");
    S2LogMessageVoidify::operator&(&local_11,poVar4);
  }
  if ((local_29 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_28);
  }
  ClearIndex(this);
  bVar2 = is_empty_or_full(this);
  if (bVar2) {
    bVar2 = is_full(this);
    if (bVar2) {
      kEmptyVertex();
    }
    else {
      kFullVertex();
    }
    pSVar1 = this->vertices_;
    pSVar1->c_[0] = local_58;
    pSVar1->c_[1] = local_50;
    pSVar1->c_[2] = local_48;
  }
  else {
    __first = this->vertices_;
    pSVar1 = this->vertices_;
    iVar3 = num_vertices(this);
    std::reverse<Vector3<double>*>(__first,pSVar1 + iVar3);
  }
  this->origin_inside_ = (this->origin_inside_ & 1U) != 1;
  pRVar5 = S2LatLngRect::lat(&this->bound_);
  dVar7 = R1Interval::lo(pRVar5);
  if (-1.5707963267948966 < dVar7) {
    pRVar5 = S2LatLngRect::lat(&this->bound_);
    dVar7 = R1Interval::hi(pRVar5);
    if (dVar7 < 1.5707963267948966) {
      S2LatLngRect::Full();
      pSVar6 = S2LatLngRect::operator=(&this->bound_,&local_80);
      S2LatLngRect::operator=(&this->subregion_bound_,pSVar6);
      S2LatLngRect::~S2LatLngRect(&local_80);
      goto LAB_004a0b8e;
    }
  }
  InitBound(this);
LAB_004a0b8e:
  InitIndex(this);
  return;
}

Assistant:

void S2Loop::Invert() {
  S2_CHECK(owns_vertices_);
  ClearIndex();
  if (is_empty_or_full()) {
    vertices_[0] = is_full() ? kEmptyVertex() : kFullVertex();
  } else {
    std::reverse(vertices_, vertices_ + num_vertices());
  }
  // origin_inside_ must be set correctly before building the S2ShapeIndex.
  origin_inside_ ^= true;
  if (bound_.lat().lo() > -M_PI_2 && bound_.lat().hi() < M_PI_2) {
    // The complement of this loop contains both poles.
    subregion_bound_ = bound_ = S2LatLngRect::Full();
  } else {
    InitBound();
  }
  InitIndex();
}